

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.h
# Opt level: O2

void __thiscall
dg::NodesSeq<dg::dda::RWNode>::NodesSeq
          (NodesSeq<dg::dda::RWNode> *this,initializer_list<dg::dda::RWNode_*> *lst)

{
  (this->nodes).super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->representant = (RWNode *)0x0;
  (this->nodes).super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (lst->_M_len != 0) {
    std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
    insert<dg::dda::RWNode*const*,void>
              ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)this,(const_iterator)0x0
               ,lst->_M_array,lst->_M_array + lst->_M_len);
    this->representant = *lst->_M_array;
  }
  return;
}

Assistant:

NodesSeq(const std::initializer_list<NodeT *> &lst) {
        if (lst.size() > 0) {
            nodes.insert(nodes.end(), lst.begin(), lst.end());
            representant = *lst.begin();
        }
    }